

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hrgls_internal_wrap.cpp
# Opt level: O0

hrgls_Status
hrgls_APICreateParametersGetCredentials
          (hrgls_APICreateParams params,uint8_t **returnCredentials,uint32_t *returnSize)

{
  uchar *puVar1;
  size_type sVar2;
  hrgls_Status s;
  uint32_t *returnSize_local;
  uint8_t **returnCredentials_local;
  hrgls_APICreateParams params_local;
  
  if (params == (hrgls_APICreateParams)0x0) {
    params_local._4_4_ = 0x3ee;
  }
  else if (returnCredentials == (uint8_t **)0x0) {
    params_local._4_4_ = 0x3e9;
  }
  else if (returnSize == (uint32_t *)0x0) {
    params_local._4_4_ = 0x3e9;
  }
  else {
    puVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(&params->credentials);
    *returnCredentials = puVar1;
    sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&params->credentials);
    *returnSize = (uint32_t)sVar2;
    params_local._4_4_ = 0;
  }
  return params_local._4_4_;
}

Assistant:

hrgls_Status hrgls_APICreateParametersGetCredentials(hrgls_APICreateParams params,
    const uint8_t **returnCredentials, uint32_t *returnSize)
  {
    hrgls_Status s = hrgls_STATUS_OKAY;
    if (!params) {
      return hrgls_STATUS_NULL_OBJECT_POINTER;
    }
    if (!returnCredentials) {
      return hrgls_STATUS_BAD_PARAMETER;
    }
    if (!returnSize) {
      return hrgls_STATUS_BAD_PARAMETER;
    }
    *returnCredentials = params->credentials.data();
    *returnSize = static_cast<uint32_t>(params->credentials.size());

    return s;
  }